

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<short>(SpirVAssembly *this,deInt64 number)

{
  Buffer<short> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator_type local_3b;
  value_type_conflict7 local_3a;
  _Vector_base<short,_std::allocator<short>_> local_38;
  
  this_00 = (Buffer<short> *)operator_new(0x20);
  local_3a = (value_type_conflict7)number;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_38,1,&local_3a,&local_3b);
  Buffer<short>::Buffer(this_00,(vector<short,_std::allocator<short>_> *)&local_38);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_38);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}